

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialog::setDirectoryUrl(QFileDialog *this,QUrl *directory)

{
  QFileDialogPrivate *this_00;
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    QFileDialogPrivate::setLastVisitedDirectory(directory);
    QFileDialogOptions::setInitialDirectory((QUrl *)(this_00->options).value.ptr);
    if ((this_00->super_QDialogPrivate).nativeDialogInUse == true) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QFileDialogPrivate::setDirectory_sys(this_00,directory);
        return;
      }
      goto LAB_004975ae;
    }
    cVar1 = QUrl::isLocalFile();
    if (cVar1 == '\0') {
      if (((this_00->super_QDialogPrivate).nativeDialogInUse == false) &&
         ((this_00->qFileDialogUi).d != (Ui_QFileDialog *)0x0)) {
        local_40.d._0_4_ = 2;
        local_40.size._4_4_ = 0;
        local_40._4_8_ = 0;
        local_40._12_8_ = 0;
        local_28 = "default";
        QMessageLogger::warning
                  ((char *)&local_40,"Non-native QFileDialog supports only local files");
      }
    }
    else {
      QUrl::toLocalFile();
      setDirectory(this,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_004975ae:
  __stack_chk_fail();
}

Assistant:

void QFileDialog::setDirectoryUrl(const QUrl &directory)
{
    Q_D(QFileDialog);
    if (!directory.isValid())
        return;

    QFileDialogPrivate::setLastVisitedDirectory(directory);
    d->options->setInitialDirectory(directory);

    if (d->nativeDialogInUse)
        d->setDirectory_sys(directory);
    else if (directory.isLocalFile())
        setDirectory(directory.toLocalFile());
    else if (Q_UNLIKELY(d->usingWidgets()))
        qWarning("Non-native QFileDialog supports only local files");
}